

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_wsi_mux_action_pending_writeable_reqs(lws *wsi)

{
  int iVar1;
  lws *local_20;
  lws *w;
  lws *wsi_local;
  
  local_20 = (wsi->mux).child_list;
  while( true ) {
    if (local_20 == (lws *)0x0) {
      iVar1 = lws_change_pollfd(wsi,4,0);
      if (iVar1 == 0) {
        wsi_local._4_4_ = 0;
      }
      else {
        wsi_local._4_4_ = -1;
      }
      return wsi_local._4_4_;
    }
    if ((local_20->mux).requested_POLLOUT != '\0') break;
    local_20 = (local_20->mux).sibling_list;
  }
  iVar1 = lws_change_pollfd(wsi,0,4);
  if (iVar1 != 0) {
    return -1;
  }
  return 0;
}

Assistant:

int
lws_wsi_mux_action_pending_writeable_reqs(struct lws *wsi)
{
	struct lws *w = wsi->mux.child_list;

	while (w) {
		if (w->mux.requested_POLLOUT) {
			if (lws_change_pollfd(wsi, 0, LWS_POLLOUT))
				return -1;
			return 0;
		}
		w = w->mux.sibling_list;
	}

	if (lws_change_pollfd(wsi, LWS_POLLOUT, 0))
		return -1;

	return 0;
}